

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int handle_include_path(dmr_C *C,stream *stream,token **list,token *token,int how)

{
  token *token_00;
  int iVar1;
  char *__s;
  size_t sVar2;
  char **local_68;
  int local_54;
  int flen;
  int expect;
  char **path;
  token *next;
  char *filename;
  int how_local;
  token *token_local;
  token **list_local;
  stream *stream_local;
  dmr_C *C_local;
  
  path = (char **)token->next;
  local_54 = 0x3e;
  iVar1 = dmrC_match_op((token *)path,0x3c);
  if (iVar1 == 0) {
    expand_list(C,&token->next);
    local_54 = 0;
    iVar1 = dmrC_match_op(token->next,0x3c);
    path = (char **)token;
    if (iVar1 != 0) {
      path = (char **)token->next;
      local_54 = 0x3e;
    }
  }
  token_00 = (token *)path[1];
  __s = token_name_sequence(C,token_00,local_54,token_00);
  sVar2 = strlen(__s);
  iVar1 = (int)sVar2 + 1;
  if (*__s == '/') {
    iVar1 = try_include(C,"",__s,iVar1,list,C->includepath);
  }
  else {
    if (how == 1) {
      _flen = stream->next_path;
    }
    else if (how == 2) {
      C->includepath[0] = "";
      _flen = C->includepath;
    }
    else {
      set_stream_include_path(C,stream);
      if (local_54 == 0) {
        local_68 = C->quote_includepath;
      }
      else {
        local_68 = C->angle_includepath;
      }
      _flen = local_68;
    }
    iVar1 = do_include_path(C,_flen,list,token_00,__s,iVar1);
  }
  if (iVar1 != 0) {
    return 0;
  }
  dmrC_error_die(C,token_00->pos,"unable to open \'%s\'",__s);
}

Assistant:

static int handle_include_path(struct dmr_C *C, struct stream *stream, struct token **list, struct token *token, int how)
{
	const char *filename;
	struct token *next;
	const char **path;
	int expect;
	int flen;

	next = token->next;
	expect = '>';
	if (!dmrC_match_op(next, '<')) {
		expand_list(C, &token->next);
		expect = 0;
		next = token;
		if (dmrC_match_op(token->next, '<')) {
			next = token->next;
			expect = '>';
		}
	}

	token = next->next;
	filename = token_name_sequence(C, token, expect, token);
	flen = (int)strlen(filename) + 1;

	/* Absolute path? */
	if (filename[0] == '/') {
		if (try_include(C, "", filename, flen, list, C->includepath))
			return 0;
		goto out;
	}

	switch (how) {
	case 1:
		path = stream->next_path;
		break;
	case 2:
		C->includepath[0] = "";
		path = C->includepath;
		break;
	default:
		/* Dir of input file is first dir to search for quoted includes */
		set_stream_include_path(C, stream);
		path = expect ? C->angle_includepath : C->quote_includepath;
		break;
	}
	/* Check the standard include paths.. */
	if (do_include_path(C, path, list, token, filename, flen))
		return 0;
out:
	dmrC_error_die(C, token->pos, "unable to open '%s'", filename);
	return 0;
}